

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReadMemory(BinaryReader *this,Limits *out_page_limits)

{
  bool bVar1;
  Result result;
  uint local_54;
  Enum local_50;
  uint32_t max32;
  Enum local_48;
  uint32_t initial32;
  byte local_40;
  byte local_3f;
  byte local_3e;
  byte local_3d;
  Enum local_3c;
  uint8_t unknown_flags;
  bool is_64;
  bool is_shared;
  bool has_max;
  uint64_t max;
  uint64_t initial;
  Limits *pLStack_20;
  uint8_t flags;
  Limits *out_page_limits_local;
  BinaryReader *this_local;
  
  _unknown_flags = 0;
  pLStack_20 = out_page_limits;
  out_page_limits_local = (Limits *)this;
  local_3c = (Enum)ReadU8(this,(uint8_t *)((long)&initial + 7),"memory flags");
  bVar1 = Failed((Result)local_3c);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    local_3d = (initial._7_1_ & 1) != 0;
    local_3e = (initial._7_1_ & 2) != 0;
    local_3f = (initial._7_1_ & 4) != 0;
    local_40 = initial._7_1_ & 0xf8;
    if (local_40 == 0) {
      if ((!(bool)local_3e) || (bVar1 = Features::threads_enabled(&this->options_->features), bVar1)
         ) {
        if (((local_3f & 1) == 0) ||
           (bVar1 = Features::memory64_enabled(&this->options_->features), bVar1)) {
          if ((local_3f & 1) == 0) {
            local_50 = (Enum)ReadU32Leb128(this,&max32,"memory initial page count");
            bVar1 = Failed((Result)local_50);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            max = (uint64_t)max32;
            if ((local_3d & 1) != 0) {
              result = ReadU32Leb128(this,&local_54,"memory max page count");
              bVar1 = Failed(result);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              _unknown_flags = (ulong)local_54;
            }
          }
          else {
            initial32 = (uint32_t)ReadU64Leb128(this,&max,"memory initial page count");
            bVar1 = Failed((Result)initial32);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            if ((local_3d & 1) != 0) {
              local_48 = (Enum)ReadU64Leb128(this,(uint64_t *)&unknown_flags,"memory max page count"
                                            );
              bVar1 = Failed((Result)local_48);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
            }
          }
          pLStack_20->has_max = (bool)(local_3d & 1);
          pLStack_20->is_shared = (bool)(local_3e & 1);
          pLStack_20->is_64 = (bool)(local_3f & 1);
          pLStack_20->initial = max;
          pLStack_20->max = _unknown_flags;
          std::vector<wabt::Limits,_std::allocator<wabt::Limits>_>::push_back
                    (&this->memories,pLStack_20);
          Result::Result((Result *)((long)&this_local + 4),Ok);
        }
        else {
          PrintError(this,"memory64 not allowed");
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
      }
      else {
        PrintError(this,"memory may not be shared: threads not allowed");
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
    else {
      PrintError(this,"malformed memory limits flag: %d",(ulong)initial._7_1_);
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadMemory(Limits* out_page_limits) {
  uint8_t flags;
  uint64_t initial;
  uint64_t max = 0;
  CHECK_RESULT(ReadU8(&flags, "memory flags"));
  bool has_max = flags & WABT_BINARY_LIMITS_HAS_MAX_FLAG;
  bool is_shared = flags & WABT_BINARY_LIMITS_IS_SHARED_FLAG;
  bool is_64 = flags & WABT_BINARY_LIMITS_IS_64_FLAG;
  const uint8_t unknown_flags = flags & ~WABT_BINARY_LIMITS_ALL_FLAGS;
  ERROR_UNLESS(unknown_flags == 0, "malformed memory limits flag: %d", flags);
  ERROR_IF(is_shared && !options_.features.threads_enabled(),
           "memory may not be shared: threads not allowed");
  ERROR_IF(is_64 && !options_.features.memory64_enabled(),
           "memory64 not allowed");
  if (is_64) {
    CHECK_RESULT(ReadU64Leb128(&initial, "memory initial page count"));
    if (has_max) {
      CHECK_RESULT(ReadU64Leb128(&max, "memory max page count"));
    }
  } else {
    uint32_t initial32;
    CHECK_RESULT(ReadU32Leb128(&initial32, "memory initial page count"));
    initial = initial32;
    if (has_max) {
      uint32_t max32;
      CHECK_RESULT(ReadU32Leb128(&max32, "memory max page count"));
      max = max32;
    }
  }

  out_page_limits->has_max = has_max;
  out_page_limits->is_shared = is_shared;
  out_page_limits->is_64 = is_64;
  out_page_limits->initial = initial;
  out_page_limits->max = max;

  // Have to keep a copy of these, to know how to interpret load/stores.
  memories.push_back(*out_page_limits);
  return Result::Ok;
}